

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

Long amrex::VisMF::Write(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how,bool set_ghost)

{
  ulong uVar1;
  undefined8 uVar2;
  Version VVar3;
  RefID RVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  literals *this;
  long lVar8;
  Long LVar9;
  size_type sVar10;
  streamoff sVar11;
  void *__src;
  fstream *pfVar12;
  double *pdVar13;
  void *pvVar14;
  NFilesIter *this_00;
  byte in_CL;
  int __c;
  FabArrayBase *__s;
  FabArrayBase *in_RDI;
  bool bVar15;
  bool bVar16;
  longdouble x;
  double dVar17;
  Real RVar18;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar19;
  undefined1 auVar20 [16];
  char *cDataPtr;
  Real *fabdata_1;
  __string_type tstr_1;
  stringstream hss_2;
  FArrayBox *fab_2;
  int hLength_1;
  MFIter mfi_3;
  Real *fabdata;
  __string_type tstr;
  stringstream hss_1;
  char *afPtr;
  FArrayBox *fab_1;
  int hLength;
  MFIter mfi_2;
  Long writePosition;
  bool canCombineFABs;
  char *allFabData;
  stringstream hss;
  FArrayBox *fab;
  MFIter mfi_1;
  Long writeDataSize;
  Long writeDataItems;
  int nFABs;
  int whichRDBytes;
  FABio *fio;
  bool oldHeader;
  NFilesIter nfi;
  string filePrefix;
  Header hdr;
  bool calcMinMax;
  Long bytesWritten;
  int coordinatorProc;
  iterator it;
  int i;
  Vector<int,_std::allocator<int>_> procsWithDataVector;
  set<int,_std::less<int>,_std::allocator<int>_> procsWithData;
  Vector<int,_std::allocator<int>_> *pmap;
  bool useSparseFPP;
  Real val;
  pair<double,_double> mm;
  int j;
  int idx;
  MFIter mfi;
  bool run_on_device;
  FabArray<amrex::FArrayBox> *the_mf;
  bool doConvert;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  undefined4 in_stack_fffffffffffff068;
  int in_stack_fffffffffffff06c;
  undefined2 in_stack_fffffffffffff070;
  undefined6 in_stack_fffffffffffff072;
  undefined4 in_stack_fffffffffffff078;
  int in_stack_fffffffffffff07c;
  NFilesIter *in_stack_fffffffffffff080;
  BaseFab<double> *in_stack_fffffffffffff088;
  undefined4 in_stack_fffffffffffff090;
  undefined4 in_stack_fffffffffffff094;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffff098;
  MFIter *in_stack_fffffffffffff0a0;
  undefined4 in_stack_fffffffffffff0a8;
  undefined4 in_stack_fffffffffffff0ac;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffff0b0;
  undefined4 in_stack_fffffffffffff0b8;
  undefined4 in_stack_fffffffffffff0bc;
  undefined8 in_stack_fffffffffffff140;
  Box *in_stack_fffffffffffff148;
  FABio *pFVar21;
  BaseFab<double> *in_stack_fffffffffffff150;
  undefined1 *puVar22;
  undefined8 in_stack_fffffffffffff158;
  undefined2 uVar24;
  BaseFab<double> *pBVar23;
  string *in_stack_fffffffffffff160;
  undefined8 in_stack_fffffffffffff168;
  NFilesIter *in_stack_fffffffffffff170;
  BaseFab<double> *in_stack_fffffffffffff1d0;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff1d8;
  Header *in_stack_fffffffffffff1e0;
  undefined8 in_stack_fffffffffffff208;
  undefined8 in_stack_fffffffffffff210;
  undefined4 in_stack_fffffffffffff218;
  undefined4 in_stack_fffffffffffff21c;
  Header *in_stack_fffffffffffff220;
  literals *in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff288;
  int in_stack_fffffffffffff28c;
  string *in_stack_fffffffffffff290;
  string local_d38 [32];
  undefined1 local_d18 [16];
  stringstream local_d08 [16];
  undefined1 local_cf8 [376];
  BaseFab<double> *local_b80;
  undefined4 local_b74;
  MFIter local_b70;
  double *local_b10;
  string local_b08 [20];
  MPI_Comm in_stack_fffffffffffff50c;
  NFilesIter *in_stack_fffffffffffff510;
  fpos local_ae8 [4];
  Header *in_stack_fffffffffffff520;
  string *in_stack_fffffffffffff528;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff530;
  undefined1 local_ac8 [376];
  void *local_950;
  BaseFab<double> *local_948;
  int local_93c;
  MFIter local_938;
  long local_8d8;
  undefined1 local_8c9;
  void *local_8c8;
  undefined1 local_8c0 [16];
  stringstream local_8b0 [16];
  undefined1 local_8a0 [376];
  BaseFab<double> *local_728;
  MFIter local_720;
  size_t local_6c0;
  long local_6b8;
  int local_6b0;
  int local_6ac;
  FABio *local_6a8;
  byte local_699;
  NFilesIter local_698;
  string local_340 [335];
  undefined1 local_1f1;
  NFilesIter *local_1f0;
  int local_1e4;
  _Self local_1e0;
  _Self local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8;
  int local_1bc;
  Vector<int,_std::allocator<int>_> *local_170;
  byte local_161;
  undefined1 local_128 [191];
  byte local_69;
  FabArrayBase *local_68;
  int local_60 [3];
  RefID local_50;
  int local_48;
  undefined1 local_31;
  byte local_25;
  FabArrayBase *local_18;
  undefined4 local_c;
  string *local_8;
  
  local_25 = in_CL & 1;
  local_18 = in_RDI;
  FArrayBox::getDataDescriptor();
  std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::operator*
            ((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> *)
             CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
  FPC::NativeRealDescriptor();
  local_31 = RealDescriptor::operator!=
                       ((RealDescriptor *)
                        CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                        (RealDescriptor *)
                        CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
  bVar16 = false;
  if ((local_25 & 1) != 0) {
    local_60 = (int  [3])FabArrayBase::nGrowVect(local_18);
    local_50.data = (Ref *)local_60._0_8_;
    RVar4.data = local_50.data;
    local_48 = local_60[2];
    in_stack_fffffffffffff290 = (string *)&local_50;
    local_c = 0;
    local_50.data._0_4_ = local_60[0];
    bVar15 = (int)local_50.data == 0;
    bVar16 = true;
    local_50.data = RVar4.data;
    local_8 = in_stack_fffffffffffff290;
    if (bVar15) {
      local_50.data._4_4_ = local_60[1];
      bVar15 = local_50.data._4_4_ == 0;
      bVar16 = true;
      if (bVar15) {
        bVar16 = local_60[2] != 0;
      }
    }
  }
  if (bVar16) {
    local_68 = local_18;
    local_69 = 0;
    __s = local_18;
    MFIter::MFIter(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   (uchar)((uint)in_stack_fffffffffffff094 >> 0x18));
    while (bVar16 = MFIter::isValid((MFIter *)(local_128 + 0x58)), bVar16) {
      pcVar7 = MFIter::index((MFIter *)(local_128 + 0x58),(char *)__s,__c);
      local_128._84_4_ = SUB84(pcVar7,0);
      local_128._80_4_ = 0;
      while (in_stack_fffffffffffff28c = local_128._80_4_, iVar5 = FabArrayBase::nComp(local_18),
            in_stack_fffffffffffff28c < iVar5) {
        if ((local_69 & 1) == 0) {
          this = (literals *)
                 FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            (MFIter *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))
          ;
          FabArrayBase::box((FabArrayBase *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            in_stack_fffffffffffff06c);
          local_128._64_16_ =
               (undefined1  [16])
               BaseFab<double>::minmax<(amrex::RunOn)1>
                         (in_stack_fffffffffffff150,in_stack_fffffffffffff148,
                          (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
        }
        else {
          this = (literals *)
                 FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            (MFIter *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))
          ;
          FabArrayBase::box((FabArrayBase *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            in_stack_fffffffffffff06c);
          in_stack_fffffffffffff280 = this;
          local_128._64_16_ =
               (undefined1  [16])
               BaseFab<double>::minmax<(amrex::RunOn)0>
                         (in_stack_fffffffffffff150,in_stack_fffffffffffff148,
                          (int)((ulong)in_stack_fffffffffffff140 >> 0x20));
        }
        dVar17 = (double)local_128._64_8_ + (double)local_128._72_8_;
        x = (longdouble)2.0;
        in_stack_fffffffffffff068 = SUB104(x,0);
        in_stack_fffffffffffff06c = (int)((unkuint10)x >> 0x20);
        in_stack_fffffffffffff070 = (undefined2)((unkuint10)x >> 0x40);
        RVar18 = literals::operator____rt(this,x);
        local_128._0_8_ = dVar17 / RVar18;
        if ((local_69 & 1) == 0) {
          FabArray<amrex::FArrayBox>::get
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                     (MFIter *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
          FabArrayBase::box((FabArrayBase *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            in_stack_fffffffffffff06c);
          __s = (FabArrayBase *)local_128;
          BaseFab<double>::setComplement<(amrex::RunOn)1>
                    ((BaseFab<double> *)in_stack_fffffffffffff0a0,
                     (double *)in_stack_fffffffffffff098,
                     (Box *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                     (int)((ulong)in_stack_fffffffffffff088 >> 0x20),(int)in_stack_fffffffffffff088)
          ;
        }
        else {
          FabArray<amrex::FArrayBox>::get
                    ((FabArray<amrex::FArrayBox> *)
                     CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                     (MFIter *)CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
          FabArrayBase::box((FabArrayBase *)
                            CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                            in_stack_fffffffffffff06c);
          __s = (FabArrayBase *)local_128;
          BaseFab<double>::setComplement<(amrex::RunOn)0>
                    ((BaseFab<double> *)in_stack_fffffffffffff0a0,
                     (double *)in_stack_fffffffffffff098,
                     (Box *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                     (int)((ulong)in_stack_fffffffffffff088 >> 0x20),(int)in_stack_fffffffffffff088)
          ;
        }
        local_128._80_4_ = local_128._80_4_ + 1;
      }
      MFIter::operator++((MFIter *)(local_128 + 0x58));
    }
    MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
  }
  local_161 = 0;
  FabArrayBase::DistributionMap(local_18);
  local_170 = DistributionMapping::ProcessorMap((DistributionMapping *)0xf7ea60);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xf7ea75);
  Vector<int,_std::allocator<int>_>::Vector((Vector<int,_std::allocator<int>_> *)0xf7ea82);
  local_1bc = 0;
  while( true ) {
    lVar8 = (long)local_1bc;
    LVar9 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0xf7eaaa);
    iVar5 = (int)((ulong)in_stack_fffffffffffff168 >> 0x20);
    uVar24 = (undefined2)((ulong)in_stack_fffffffffffff158 >> 0x30);
    if (LVar9 <= lVar8) break;
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
               CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
    pVar19 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                        (value_type *)in_stack_fffffffffffff088);
    local_1d0 = (_Base_ptr)pVar19.first._M_node;
    local_1c8 = pVar19.second;
    local_1bc = local_1bc + 1;
  }
  if ((allowSparseWrites & 1) != 0) {
    sVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)0xf7eb5b);
    iVar5 = (int)((ulong)in_stack_fffffffffffff168 >> 0x20);
    uVar24 = (undefined2)((ulong)in_stack_fffffffffffff158 >> 0x30);
    if ((int)sVar10 < nOutFiles) {
      local_161 = 1;
      local_1d8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
      while( true ) {
        local_1e0._M_node =
             (_Base_ptr)
             std::set<int,_std::less<int>,_std::allocator<int>_>::end
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068));
        bVar16 = std::operator!=(&local_1d8,&local_1e0);
        iVar5 = (int)((ulong)in_stack_fffffffffffff168 >> 0x20);
        uVar24 = (undefined2)((ulong)in_stack_fffffffffffff158 >> 0x30);
        if (!bVar16) break;
        std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0xf7ebbd);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff080,
                   (value_type *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078));
        std::_Rb_tree_const_iterator<int>::operator++
                  ((_Rb_tree_const_iterator<int> *)
                   CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
      }
    }
  }
  local_1e4 = ParallelDescriptor::IOProcessorNumber();
  local_1f0 = (NFilesIter *)0x0;
  local_1f1 = 0;
  ParallelDescriptor::Communicator();
  Header::Header(in_stack_fffffffffffff220,
                 (FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffff21c,in_stack_fffffffffffff218),
                 (How)((ulong)in_stack_fffffffffffff210 >> 0x20),(Version)in_stack_fffffffffffff210,
                 SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0),
                 (MPI_Comm)in_stack_fffffffffffff208);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff098,
                 (char *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
  NFilesIter::NFilesIter
            (in_stack_fffffffffffff170,iVar5,in_stack_fffffffffffff160,SUB21((ushort)uVar24 >> 8,0),
             SUB21(uVar24,0));
  local_699 = currentVersion == 1;
  if ((local_161 & 1) == 0) {
    if ((useDynamicSetSelection & 1) != 0) {
      NFilesIter::SetDynamic(in_stack_fffffffffffff080,in_stack_fffffffffffff07c);
    }
  }
  else {
    NFilesIter::SetSparseFPP
              ((NFilesIter *)CONCAT44(in_stack_fffffffffffff0bc,in_stack_fffffffffffff0b8),
               in_stack_fffffffffffff0b0);
  }
  while( true ) {
    bVar16 = NFilesIter::ReadyToWrite
                       (in_stack_fffffffffffff080,SUB41((uint)in_stack_fffffffffffff07c >> 0x18,0));
    if (!bVar16) break;
    local_6a8 = FArrayBox::getFABio();
    std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::operator->
              ((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> *)
               0xf7edbe);
    local_6ac = RealDescriptor::numBytes((RealDescriptor *)0xf7edc6);
    local_6b0 = 0;
    local_6b8 = 0;
    local_6c0 = 0;
    MFIter::MFIter(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                   (uchar)((uint)in_stack_fffffffffffff094 >> 0x18));
    while( true ) {
      bVar16 = MFIter::isValid(&local_720);
      if (!bVar16) break;
      local_728 = &FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)
                              CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                              (MFIter *)
                              CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))->
                   super_BaseFab<double>;
      if ((local_699 & 1) != 0) {
        std::__cxx11::stringstream::stringstream(local_8b0);
        pFVar21 = local_6a8;
        puVar22 = local_8a0;
        pBVar23 = local_728;
        uVar6 = BaseFab<double>::nComp(local_728);
        (*pFVar21->_vptr_FABio[6])(pFVar21,puVar22,pBVar23,(ulong)uVar6);
        auVar20 = std::ostream::tellp();
        local_8c0 = auVar20;
        sVar11 = std::fpos::operator_cast_to_long((fpos *)local_8c0);
        local_1f0 = (NFilesIter *)(sVar11 + (long)local_1f0);
        std::__cxx11::stringstream::~stringstream(local_8b0);
      }
      BaseFab<double>::box(local_728);
      in_stack_fffffffffffff1e0 = (Header *)Box::numPts((Box *)in_stack_fffffffffffff080);
      iVar5 = FabArrayBase::nComp(local_18);
      local_1f0 = (NFilesIter *)
                  ((long)in_stack_fffffffffffff1e0 * (long)iVar5 * (long)local_6ac + (long)local_1f0
                  );
      local_6b0 = local_6b0 + 1;
      MFIter::operator++(&local_720);
    }
    MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
    local_8c8 = (void *)0x0;
    local_8c9 = 0;
    if (((1 < local_6b0) || ((local_31 & 1) != 0)) && ((useSingleWrite & 1) != 0)) {
      local_8c8 = operator_new__((ulong)local_1f0,(nothrow_t *)&std::nothrow);
    }
    local_8c9 = local_8c8 != (void *)0x0;
    flags_ = (uchar)((uint)in_stack_fffffffffffff094 >> 0x18);
    if ((bool)local_8c9) {
      local_8d8 = 0;
      MFIter::MFIter(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,flags_);
      while( true ) {
        bVar16 = MFIter::isValid(&local_938);
        if (!bVar16) break;
        local_93c = 0;
        local_948 = &FabArray<amrex::FArrayBox>::operator[]
                               ((FabArray<amrex::FArrayBox> *)
                                CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                                (MFIter *)
                                CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))->
                     super_BaseFab<double>;
        BaseFab<double>::box(local_948);
        in_stack_fffffffffffff1d8 =
             (FabArray<amrex::FArrayBox> *)Box::numPts((Box *)in_stack_fffffffffffff080);
        iVar5 = FabArrayBase::nComp(local_18);
        local_6b8 = (long)in_stack_fffffffffffff1d8 * (long)iVar5;
        local_6c0 = local_6b8 * local_6ac;
        local_950 = (void *)((long)local_8c8 + local_8d8);
        if ((local_699 & 1) != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffff528);
          pFVar21 = local_6a8;
          in_stack_fffffffffffff1d0 = local_948;
          uVar6 = BaseFab<double>::nComp(local_948);
          (*pFVar21->_vptr_FABio[6])(pFVar21,local_ac8,in_stack_fffffffffffff1d0,(ulong)uVar6);
          auVar20 = std::ostream::tellp();
          in_stack_fffffffffffff520 = auVar20._8_8_;
          _local_ae8 = auVar20._0_8_;
          sVar11 = std::fpos::operator_cast_to_long(local_ae8);
          local_93c = (int)sVar11;
          std::__cxx11::stringstream::str();
          pvVar14 = local_950;
          __src = (void *)std::__cxx11::string::c_str();
          memcpy(pvVar14,__src,(long)local_93c);
          std::__cxx11::string::~string(local_b08);
          std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffff528);
        }
        local_b10 = BaseFab<double>::dataPtr
                              (in_stack_fffffffffffff088,
                               (int)((ulong)in_stack_fffffffffffff080 >> 0x20));
        if ((local_31 & 1) == 0) {
          memcpy((void *)((long)local_950 + (long)local_93c),local_b10,local_6c0);
        }
        else {
          std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::
          operator*((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                     *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
          RealDescriptor::convertFromNativeFormat
                    (in_stack_fffffffffffff0b0,
                     CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
                     in_stack_fffffffffffff0a0,(RealDescriptor *)in_stack_fffffffffffff098);
        }
        local_8d8 = (long)local_93c + local_6c0 + local_8d8;
        MFIter::operator++(&local_938);
      }
      MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
      pfVar12 = NFilesIter::Stream(&local_698);
      std::ostream::write((char *)(pfVar12 + 0x10),(long)local_8c8);
      NFilesIter::Stream(&local_698);
      std::ostream::flush();
      if (local_8c8 != (void *)0x0) {
        operator_delete__(local_8c8);
      }
    }
    else {
      MFIter::MFIter(in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,flags_);
      while( true ) {
        bVar16 = MFIter::isValid(&local_b70);
        if (!bVar16) break;
        local_b74 = 0;
        local_b80 = &FabArray<amrex::FArrayBox>::operator[]
                               ((FabArray<amrex::FArrayBox> *)
                                CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070),
                                (MFIter *)
                                CONCAT44(in_stack_fffffffffffff06c,in_stack_fffffffffffff068))->
                     super_BaseFab<double>;
        BaseFab<double>::box(local_b80);
        LVar9 = Box::numPts((Box *)in_stack_fffffffffffff080);
        iVar5 = FabArrayBase::nComp(local_18);
        local_6b8 = LVar9 * iVar5;
        local_6c0 = local_6b8 * local_6ac;
        if ((local_699 & 1) != 0) {
          std::__cxx11::stringstream::stringstream(local_d08);
          puVar22 = local_cf8;
          pFVar21 = local_6a8;
          pBVar23 = local_b80;
          uVar6 = BaseFab<double>::nComp(local_b80);
          (*pFVar21->_vptr_FABio[6])(pFVar21,puVar22,pBVar23,(ulong)uVar6);
          auVar20 = std::ostream::tellp();
          local_d18 = auVar20;
          sVar11 = std::fpos::operator_cast_to_long((fpos *)local_d18);
          local_b74 = (undefined4)sVar11;
          std::__cxx11::stringstream::str();
          pfVar12 = NFilesIter::Stream(&local_698);
          lVar8 = std::__cxx11::string::c_str();
          std::ostream::write((char *)(pfVar12 + 0x10),lVar8);
          NFilesIter::Stream(&local_698);
          std::ostream::flush();
          std::__cxx11::string::~string(local_d38);
          std::__cxx11::stringstream::~stringstream(local_d08);
        }
        pdVar13 = BaseFab<double>::dataPtr
                            (in_stack_fffffffffffff088,
                             (int)((ulong)in_stack_fffffffffffff080 >> 0x20));
        if ((local_31 & 1) == 0) {
          pfVar12 = NFilesIter::Stream(&local_698);
          std::ostream::write((char *)(pfVar12 + 0x10),(long)pdVar13);
          NFilesIter::Stream(&local_698);
          std::ostream::flush();
        }
        else {
          pvVar14 = operator_new__(local_6c0);
          std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::
          operator*((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>
                     *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
          RealDescriptor::convertFromNativeFormat
                    (in_stack_fffffffffffff0b0,
                     CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),
                     in_stack_fffffffffffff0a0,(RealDescriptor *)in_stack_fffffffffffff098);
          pfVar12 = NFilesIter::Stream(&local_698);
          std::ostream::write((char *)(pfVar12 + 0x10),(long)pvVar14);
          NFilesIter::Stream(&local_698);
          std::ostream::flush();
          if (pvVar14 != (void *)0x0) {
            operator_delete__(pvVar14);
          }
        }
        MFIter::operator++(&local_b70);
      }
      MFIter::~MFIter((MFIter *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
    }
    NFilesIter::operator++
              ((NFilesIter *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
  }
  bVar16 = NFilesIter::GetDynamic(&local_698);
  if (bVar16) {
    local_1e4 = NFilesIter::CoordinatorProc(&local_698);
  }
  if ((currentVersion == 1) || (currentVersion == 3)) {
    ParallelDescriptor::Communicator();
    Header::CalculateMinMax
              (in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,
               (int)((ulong)in_stack_fffffffffffff1d0 >> 0x20),(MPI_Comm)in_stack_fffffffffffff1d0);
  }
  ParallelDescriptor::Communicator();
  uVar2 = _local_ae8;
  uVar1 = (ulong)_local_ae8 >> 0x20;
  VVar3 = (Version)uVar1;
  _local_ae8 = uVar2;
  FindOffsets(in_stack_fffffffffffff530,in_stack_fffffffffffff528,in_stack_fffffffffffff520,VVar3,
              in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
  ParallelDescriptor::Communicator();
  LVar9 = WriteHeader(in_stack_fffffffffffff290,
                      (Header *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),
                      (int)((ulong)in_stack_fffffffffffff280 >> 0x20),
                      (MPI_Comm)in_stack_fffffffffffff280);
  this_00 = (NFilesIter *)(LVar9 + (long)local_1f0);
  local_1f0 = this_00;
  NFilesIter::~NFilesIter(this_00);
  std::__cxx11::string::~string(local_340);
  Header::~Header((Header *)CONCAT62(in_stack_fffffffffffff072,in_stack_fffffffffffff070));
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0xf7fa6f);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0xf7fa7c);
  std::unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_>::~unique_ptr
            ((unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> *)
             this_00);
  return (Long)this_00;
}

Assistant:

Long
VisMF::Write (const FabArray<FArrayBox>&    mf,
              const std::string& mf_name,
              VisMF::How         how,
              bool               set_ghost)
{
    BL_PROFILE("VisMF::Write(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);

    // ---- add stream retry
    // ---- add stream buffer (to nfiles)
    auto whichRD = FArrayBox::getDataDescriptor();
    bool doConvert(*whichRD != FPC::NativeRealDescriptor());

    if(set_ghost && mf.nGrowVect() != 0) {
        FabArray<FArrayBox>* the_mf = const_cast<FabArray<FArrayBox>*>(&mf);

        bool run_on_device = Gpu::inLaunchRegion()
            && (mf.arena()->isManaged() || mf.arena()->isDevice());

        for(MFIter mfi(*the_mf); mfi.isValid(); ++mfi) {
            const int idx(mfi.index());

            for(int j(0); j < mf.nComp(); ++j) {
                auto mm = (run_on_device) ? mf[mfi].minmax<RunOn::Device>(mf.box(idx),j)
                                          : mf[mfi].minmax<RunOn::Host  >(mf.box(idx),j);
                const Real val = (mm.first + mm.second) / 2.0_rt;
                if (run_on_device) {
                    the_mf->get(mfi).setComplement<RunOn::Device>(val, mf.box(idx), j, 1);
                } else {
                    the_mf->get(mfi).setComplement<RunOn::Host>(val, mf.box(idx), j, 1);
                }
            }
        }
    }

    // ---- check if mf has sparse data
    bool useSparseFPP(false);
    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();
    std::set<int> procsWithData;
    Vector<int> procsWithDataVector;
    for(int i(0); i < pmap.size(); ++i) {
      procsWithData.insert(pmap[i]);
    }
    if(allowSparseWrites && (static_cast<int>(procsWithData.size()) < nOutFiles)) {
      useSparseFPP = true;
//      amrex::Print() << "SSSSSSSS:  in VisMF::Write:  useSparseFPP for:  " << mf_name << '\n';
      for(std::set<int>::iterator it = procsWithData.begin(); it != procsWithData.end(); ++it) {
        procsWithDataVector.push_back(*it);
      }
    }

    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    Long bytesWritten(0);
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    std::string filePrefix(mf_name + FabFileSuffix);

    NFilesIter nfi(nOutFiles, filePrefix, groupSets, setBuf);

    bool oldHeader(currentVersion == VisMF::Header::Version_v1);

    if(useSparseFPP) {
        nfi.SetSparseFPP(procsWithDataVector);
    } else if(useDynamicSetSelection) {
        nfi.SetDynamic();
    }
    for( ; nfi.ReadyToWrite(); ++nfi) {
        // ---- find the total number of bytes including fab headers if needed
        const FABio &fio = FArrayBox::getFABio();
        int whichRDBytes(whichRD->numBytes()), nFABs(0);
        Long writeDataItems(0), writeDataSize(0);
        for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
            const FArrayBox &fab = mf[mfi];
            if(oldHeader) {
                std::stringstream hss;
                fio.write_header(hss, fab, fab.nComp());
                bytesWritten += static_cast<std::streamoff>(hss.tellp());
            }
            bytesWritten += fab.box().numPts() * mf.nComp() * whichRDBytes;
            ++nFABs;
        }
        char *allFabData(nullptr);
        bool canCombineFABs(false);
        if((nFABs > 1 || doConvert) && VisMF::useSingleWrite) {
            allFabData = new(std::nothrow) char[bytesWritten];
        }    // ---- else { no need to make a copy for one fab }
        if(allFabData == nullptr) {
            canCombineFABs = false;
        } else {
            canCombineFABs = true;
        }

        if(canCombineFABs) {
            Long writePosition(0);
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                char *afPtr = allFabData + writePosition;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    std::memcpy(afPtr, tstr.c_str(), hLength);  // ---- the fab header
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (afPtr + hLength),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                } else {    // ---- copy from the fab
                    memcpy(afPtr + hLength, fabdata, writeDataSize);
                }
                writePosition += hLength + writeDataSize;
            }
            nfi.Stream().write(allFabData, bytesWritten);
            nfi.Stream().flush();
            delete [] allFabData;

        } else {    // ---- write fabs individually
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    nfi.Stream().write(tstr.c_str(), hLength);    // ---- the fab header
                    nfi.Stream().flush();
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    char *cDataPtr = new char[writeDataSize];
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (cDataPtr),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                    nfi.Stream().write(cDataPtr, writeDataSize);
                    nfi.Stream().flush();
                    delete [] cDataPtr;
                } else {    // ---- copy from the fab
                    nfi.Stream().write((char *) fabdata, writeDataSize);
                    nfi.Stream().flush();
                }
            }
        }
    }

    if(nfi.GetDynamic()) {
        coordinatorProc = nfi.CoordinatorProc();
    }

    if(currentVersion == VisMF::Header::Version_v1 ||
       currentVersion == VisMF::Header::NoFabHeaderMinMax_v1)
    {
        hdr.CalculateMinMax(mf, coordinatorProc);
    }

    VisMF::FindOffsets(mf, filePrefix, hdr, currentVersion, nfi,
                       ParallelDescriptor::Communicator());

    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}